

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

Point * __thiscall
MeshLib::Point::rotate(Point *__return_storage_ptr__,Point *this,double theta,Point *vector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar7 = cos(theta);
  dVar8 = sin(theta);
  dVar1 = this->v[0];
  dVar2 = vector->v[0];
  dVar3 = this->v[1];
  dVar4 = this->v[2];
  dVar5 = vector->v[1];
  dVar6 = vector->v[2];
  dVar10 = dVar4 * dVar6 + dVar1 * dVar2 + dVar3 * dVar5;
  dVar9 = 1.0 - dVar7;
  __return_storage_ptr__->v[0] =
       dVar8 * (dVar6 * dVar3 - dVar4 * dVar5) + dVar7 * dVar1 + dVar9 * dVar10 * dVar2;
  __return_storage_ptr__->v[1] =
       dVar8 * (dVar2 * dVar4 - dVar1 * dVar6) + dVar7 * dVar3 + dVar9 * dVar10 * dVar5;
  __return_storage_ptr__->v[2] =
       (dVar1 * dVar5 - dVar2 * dVar3) * dVar8 + dVar4 * dVar7 + dVar6 * dVar10 * dVar9;
  return __return_storage_ptr__;
}

Assistant:

Point Point::rotate(double theta, Point vector)
{
	Point result;
	double cos_t = cos(theta);
	double sin_t = sin(theta);
	result = vector * (v[0] * vector[0] + v[1] * vector[1] + v[2] * vector[2]) * (1-cos_t);
	result[0] += v[0] * cos_t;
	result[1] += v[1] * cos_t;
	result[2] += v[2] * cos_t;
	result[0] += (v[1] * vector[2] - v[2] * vector[1]) * sin_t;
	result[1] += (v[2] * vector[0] - v[0] * vector[2]) * sin_t;
	result[2] += (v[0] * vector[1] - v[1] * vector[0]) * sin_t;
	return result;

}